

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_file(uchar **out,uint *w,uint *h,char *filename,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint local_44;
  size_t sStack_40;
  uint error;
  size_t buffersize;
  uchar *buffer;
  uint bitdepth_local;
  LodePNGColorType colortype_local;
  char *filename_local;
  uint *h_local;
  uint *w_local;
  uchar **out_local;
  
  buffer._0_4_ = bitdepth;
  buffer._4_4_ = colortype;
  _bitdepth_local = filename;
  filename_local = (char *)h;
  h_local = w;
  w_local = (uint *)out;
  local_44 = lodepng_load_file((uchar **)&buffersize,&stack0xffffffffffffffc0,filename);
  if (local_44 == 0) {
    local_44 = lodepng_decode_memory
                         ((uchar **)w_local,h_local,(uint *)filename_local,(uchar *)buffersize,
                          sStack_40,buffer._4_4_,(uint)buffer);
  }
  lodepng_free((void *)buffersize);
  return local_44;
}

Assistant:

unsigned lodepng_decode_file(unsigned char** out, unsigned* w, unsigned* h, const char* filename,
                             LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned char* buffer;
  size_t buffersize;
  unsigned error;
  error = lodepng_load_file(&buffer, &buffersize, filename);
  if(!error) error = lodepng_decode_memory(out, w, h, buffer, buffersize, colortype, bitdepth);
  lodepng_free(buffer);
  return error;
}